

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O0

bool Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::RescanObject
               (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *block,char *objectAddress,
               uint localObjectSize,uint objectIndex,Recycler *recycler)

{
  bool bVar1;
  Recycler *recycler_local;
  uint objectIndex_local;
  uint localObjectSize_local;
  char *objectAddress_local;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *block_local;
  
  bVar1 = Recycler::AddMark(recycler,objectAddress,(ulong)localObjectSize);
  if (bVar1) {
    (recycler->collectionStats).markData.rescanObjectCount =
         (recycler->collectionStats).markData.rescanObjectCount + 1;
    (recycler->collectionStats).markData.rescanObjectByteCount =
         (ulong)localObjectSize + (recycler->collectionStats).markData.rescanObjectByteCount;
  }
  return bVar1;
}

Assistant:

bool
SmallNormalHeapBlockT<TBlockAttributes>::RescanObject(SmallNormalHeapBlockT<TBlockAttributes>* block,
    __in_ecount(localObjectSize) char * objectAddress, uint localObjectSize,
    uint objectIndex, Recycler * recycler)
{
    // REVIEW: This would be a good assert to have but we don't have the heap block here
    // Assert(block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    if (!recycler->AddMark(objectAddress, localObjectSize))
    {
        // Failed to add to the mark stack due to OOM.
        return false;
    }

    RECYCLER_STATS_INC(recycler, markData.rescanObjectCount);
    RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize);

    return true;
}